

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

bool __thiscall
ExecutorRegVm::ExecCall
          (ExecutorRegVm *this,uint microcodePos,uint functionId,RegVmCmd *instruction,
          RegVmRegister *regFilePtr)

{
  uint uVar1;
  char *pcVar2;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *regFilePtr_00;
  int iVar3;
  bool bVar4;
  uint newSize;
  uint uVar5;
  uint uVar6;
  RegVmReturnType RVar7;
  longlong lVar8;
  uint *puVar9;
  uint *puVar10;
  uint *puVar11;
  uint size_2;
  uint offset_2;
  uint reg_2;
  uint *curr;
  RegVmReturnType execResultType;
  RegVmRegister *regFileTop;
  uint stackSize;
  uint argumentsSize;
  uint prevDataSize;
  uint local_7c;
  uint local_78;
  uint size_1;
  uint offset_1;
  uint reg_1;
  uint *curr_1;
  uint local_5c;
  byte local_56;
  byte local_55;
  uint address;
  uchar resultType;
  uint uStack_50;
  uchar resultReg;
  uint size;
  uint offset;
  uint reg;
  uint *microcode;
  ExternFuncInfo *target;
  uint *tempStackPtr;
  RegVmRegister *regFilePtr_local;
  RegVmCmd *instruction_local;
  uint functionId_local;
  uint microcodePos_local;
  ExecutorRegVm *this_local;
  
  target = (ExternFuncInfo *)this->tempStackArrayBase;
  tempStackPtr = (uint *)regFilePtr;
  regFilePtr_local = (RegVmRegister *)instruction;
  instruction_local._0_4_ = functionId;
  instruction_local._4_4_ = microcodePos;
  _functionId_local = this;
  microcode = &FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,functionId)->
               offsetToName;
  puVar9 = (this->exLinker->exRegVmConstants).data + instruction_local._4_4_;
  while (_offset = puVar9, *_offset != 1) {
    puVar9 = _offset + 1;
    switch(*_offset) {
    case 2:
      target->offsetToName = tempStackPtr[(ulong)*puVar9 * 2];
      target = (ExternFuncInfo *)&target->regVmAddress;
      puVar9 = _offset + 2;
      break;
    case 3:
      uVar1 = (tempStackPtr + (ulong)*puVar9 * 2)[1];
      target->offsetToName = (tempStackPtr + (ulong)*puVar9 * 2)[0];
      target->regVmAddress = uVar1;
      target = (ExternFuncInfo *)&target->regVmCodeSize;
      puVar9 = _offset + 2;
      break;
    case 4:
      target->offsetToName = *puVar9;
      target = (ExternFuncInfo *)&target->regVmAddress;
      puVar9 = _offset + 2;
      break;
    case 5:
      _offset = _offset + 2;
      anon_unknown.dwarf_1687fe::vmStoreLong(target,(ulong)*puVar9);
      target = (ExternFuncInfo *)&target->regVmCodeSize;
      puVar9 = _offset;
      break;
    case 6:
      size = *puVar9;
      puVar9 = _offset + 3;
      uStack_50 = _offset[2];
      _offset = _offset + 4;
      address = *puVar9;
      memcpy(target,(void *)(*(long *)(tempStackPtr + (ulong)size * 2) + (ulong)uStack_50),
             (ulong)address);
      target = (ExternFuncInfo *)(&target->offsetToName + (address >> 2));
      puVar9 = _offset;
    }
  }
  puVar9 = _offset + 2;
  local_55 = (byte)_offset[1];
  _offset = _offset + 3;
  local_56 = (byte)*puVar9;
  local_5c = microcode[1];
  if (local_5c == 0xffffffff) {
    curr_1 = (uint *)(regFilePtr_local + 1);
    FastVector<RegVmCmd_*,_false,_false>::push_back(&this->callStack,(RegVmCmd **)&curr_1);
    target = (ExternFuncInfo *)((long)target + (ulong)(microcode[0x19] >> 2) * -4);
    if (target != (ExternFuncInfo *)this->tempStackArrayBase) {
      __assert_fail("tempStackPtr == tempStackArrayBase",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x571,
                    "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                   );
    }
    if (*(long *)(microcode + 0xb) == 0) {
      bVar4 = RunExternalFunction(this,(uint)instruction_local,(uint *)target);
      if (!bVar4) {
        return false;
      }
    }
    else {
      (**(code **)(microcode + 0xb))(*(undefined8 *)(microcode + 9),target,target);
      if ((this->callContinue & 1U) == 0) {
        return false;
      }
    }
    FastVector<RegVmCmd_*,_false,_false>::pop_back(&this->callStack);
    if (local_56 == 1) {
      iVar3 = target->regVmAddress;
      (tempStackPtr + (ulong)local_55 * 2)[0] = target->offsetToName;
      (tempStackPtr + (ulong)local_55 * 2)[1] = iVar3;
    }
    else if (local_56 == 2) {
      iVar3 = target->regVmAddress;
      (tempStackPtr + (ulong)local_55 * 2)[0] = target->offsetToName;
      (tempStackPtr + (ulong)local_55 * 2)[1] = iVar3;
    }
    else if (local_56 == 3) {
      tempStackPtr[(ulong)local_55 * 2] = target->offsetToName;
    }
    _offset_1 = target;
    puVar9 = _offset;
    while (_offset = puVar9, *_offset != 7) {
      puVar9 = _offset + 1;
      uVar1 = *_offset;
      if (uVar1 == 8) {
        tempStackPtr[(ulong)*puVar9 * 2] = _offset_1->offsetToName;
        _offset_1 = (ExternFuncInfo *)&_offset_1->regVmAddress;
        puVar9 = _offset + 2;
      }
      else if (uVar1 == 9) {
        _offset = puVar9;
        lVar8 = anon_unknown.dwarf_1687fe::vmLoadLong(_offset_1);
        *(longlong *)(tempStackPtr + (ulong)*_offset * 2) = lVar8;
        _offset_1 = (ExternFuncInfo *)&_offset_1->regVmCodeSize;
        puVar9 = _offset + 1;
      }
      else if (uVar1 == 10) {
        size_1 = *puVar9;
        puVar9 = _offset + 3;
        local_78 = _offset[2];
        _offset = _offset + 4;
        local_7c = *puVar9;
        memcpy((void *)(*(long *)(tempStackPtr + (ulong)size_1 * 2) + (ulong)local_78),_offset_1,
               (ulong)local_7c);
        _offset_1 = (ExternFuncInfo *)(&_offset_1->offsetToName + (local_7c >> 2));
        puVar9 = _offset;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    _argumentsSize = (RegVmCmd *)(regFilePtr_local + 1);
    FastVector<RegVmCmd_*,_false,_false>::push_back(&this->callStack,(RegVmCmd **)&argumentsSize);
    newSize = FastVector<char,_true,_true>::size(&this->dataStack);
    uVar1 = microcode[0x19];
    uVar5 = microcode[0x1a] + 0xf & 0xfffffff0;
    uVar6 = FastVector<char,_true,_true>::size(&this->dataStack);
    if ((uVar6 & 0xf) != 0) {
      __assert_fail("dataStack.size() % 16 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x5b5,
                    "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                   );
    }
    if (uVar5 < uVar1) {
      __assert_fail("argumentsSize <= stackSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x5b6,
                    "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                   );
    }
    uVar6 = FastVector<char,_true,_true>::size(&this->dataStack);
    if (uVar6 + uVar5 < (this->dataStack).max) {
      target = (ExternFuncInfo *)((long)target + (ulong)(microcode[0x19] >> 2) * -4);
      if (target != (ExternFuncInfo *)this->tempStackArrayBase) {
        __assert_fail("tempStackPtr == tempStackArrayBase",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                      ,0x5c2,
                      "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                     );
      }
      pcVar2 = (this->dataStack).data;
      uVar6 = FastVector<char,_true,_true>::size(&this->dataStack);
      memcpy(pcVar2 + uVar6,target,(ulong)uVar1);
      regFilePtr_00 = &this->regFileLastTop->field_0;
      this->regFileLastTop = (RegVmRegister *)(regFilePtr_00 + (int)microcode[3]);
      if (this->regFileLastTop < this->regFileArrayEnd) {
        uVar6 = FastVector<char,_true,_true>::size(&this->dataStack);
        FastVector<char,_true,_true>::resize(&this->dataStack,uVar6 + uVar5);
        if (uVar5 != uVar1) {
          memset((this->dataStack).data + (ulong)uVar1 + (ulong)newSize,0,(ulong)(uVar5 - uVar1));
        }
        *regFilePtr_00 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
        regFilePtr_00[1].longValue = (int64_t)((this->dataStack).data + newSize);
        regFilePtr_00[2] =
             (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data;
        regFilePtr_00[3].longValue = (int64_t)regFilePtr_00;
        memset(regFilePtr_00 + 4,0,
               (((long)this->regFileLastTop - (long)regFilePtr_00 >> 3) + -4) * 8);
        RVar7 = RunCode(this->codeBase + local_5c,(RegVmRegister *)regFilePtr_00,this,this->codeBase
                       );
        if (RVar7 == rvrError) {
          this_local._7_1_ = false;
        }
        else {
          if (RVar7 != local_56) {
            __assert_fail("execResultType == resultType",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                          ,0x5e3,
                          "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                         );
          }
          this->regFileLastTop = (RegVmRegister *)regFilePtr_00;
          FastVector<char,_true,_true>::shrink(&this->dataStack,newSize);
          if (local_56 == 1) {
            iVar3 = target->regVmAddress;
            (tempStackPtr + (ulong)local_55 * 2)[0] = target->offsetToName;
            (tempStackPtr + (ulong)local_55 * 2)[1] = iVar3;
          }
          else if (local_56 == 2) {
            iVar3 = target->regVmAddress;
            (tempStackPtr + (ulong)local_55 * 2)[0] = target->offsetToName;
            (tempStackPtr + (ulong)local_55 * 2)[1] = iVar3;
          }
          else if (local_56 == 3) {
            tempStackPtr[(ulong)local_55 * 2] = target->offsetToName;
          }
          _offset_2 = target;
          puVar9 = _offset;
          while (_offset = puVar9, *_offset != 7) {
            puVar9 = _offset + 1;
            uVar1 = *_offset;
            if (uVar1 == 8) {
              tempStackPtr[(ulong)*puVar9 * 2] = _offset_2->offsetToName;
              _offset_2 = (ExternFuncInfo *)&_offset_2->regVmAddress;
              puVar9 = _offset + 2;
            }
            else if (uVar1 == 9) {
              _offset = puVar9;
              lVar8 = anon_unknown.dwarf_1687fe::vmLoadLong(_offset_2);
              *(longlong *)(tempStackPtr + (ulong)*_offset * 2) = lVar8;
              _offset_2 = (ExternFuncInfo *)&_offset_2->regVmCodeSize;
              puVar9 = _offset + 1;
            }
            else if (uVar1 == 10) {
              puVar10 = _offset + 2;
              puVar11 = _offset + 3;
              _offset = _offset + 4;
              uVar1 = *puVar11;
              memcpy((void *)(*(long *)(tempStackPtr + (ulong)*puVar9 * 2) + (ulong)*puVar10),
                     _offset_2,(ulong)uVar1);
              _offset_2 = (ExternFuncInfo *)(&_offset_2->offsetToName + (uVar1 >> 2));
              puVar9 = _offset;
            }
          }
          this_local._7_1_ = true;
        }
      }
      else {
        Stop(this,"ERROR: register overflow");
        this_local._7_1_ = false;
      }
    }
    else {
      Stop(this,"ERROR: stack overflow");
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ExecutorRegVm::ExecCall(unsigned microcodePos, unsigned functionId, RegVmCmd * const instruction, RegVmRegister * const regFilePtr)
{
	unsigned *tempStackPtr = tempStackArrayBase;

	ExternFuncInfo &target = exFunctions[functionId];

	// Push arguments
	unsigned *microcode = exLinker->exRegVmConstants.data + microcodePos;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			*tempStackPtr = regFilePtr[*microcode++].intValue;
			tempStackPtr += 1;
			break;
		case rvmiPushQword:
			memcpy(tempStackPtr, &regFilePtr[*microcode++].longValue, sizeof(long long));
			tempStackPtr += 2;
			break;
		case rvmiPushImm:
			*tempStackPtr = *microcode++;
			tempStackPtr += 1;
			break;
		case rvmiPushImmq:
			vmStoreLong(tempStackPtr, *microcode++);
			tempStackPtr += 2;
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;
			memcpy(tempStackPtr, (char*)regFilePtr[reg].ptrValue + offset, size);
			tempStackPtr += size >> 2;
		}
		break;
		}
	}

	microcode++;

	unsigned char resultReg = *microcode++ & 0xff;
	unsigned char resultType = *microcode++ & 0xff;

	unsigned address = target.regVmAddress;

	if(address == ~0u)
	{
		callStack.push_back(instruction + 1);

		// Take arguments
		tempStackPtr -= target.argumentSize >> 2;

		assert(tempStackPtr == tempStackArrayBase);

		if(target.funcPtrWrap)
		{
			target.funcPtrWrap(target.funcPtrWrapTarget, (char*)tempStackPtr, (char*)tempStackPtr);

			if(!callContinue)
				return false;
		}
		else
		{
			if(!RunExternalFunction(functionId, tempStackPtr))
				return false;
		}

		callStack.pop_back();

		switch(resultType)
		{
		case rvrDouble:
			memcpy(&regFilePtr[resultReg].doubleValue, tempStackPtr, sizeof(double));
			break;
		case rvrLong:
			memcpy(&regFilePtr[resultReg].longValue, tempStackPtr, sizeof(long long));
			break;
		case rvrInt:
			regFilePtr[resultReg].intValue = *tempStackPtr;
			break;
		default:
			break;
		}

		unsigned *curr = tempStackPtr;

		while(*microcode != rvmiReturn)
		{
			switch(*microcode++)
			{
			case rvmiPop:
				regFilePtr[*microcode++].intValue = *curr;
				curr += 1;
				break;
			case rvmiPopq:
				regFilePtr[*microcode++].longValue = vmLoadLong(curr);
				curr += 2;
				break;
			case rvmiPopMem:
			{
				unsigned reg = *microcode++;
				unsigned offset = *microcode++;
				unsigned size = *microcode++;
				memcpy((char*)regFilePtr[reg].ptrValue + offset, curr, size);
				curr += size >> 2;
			}
			break;
			}
		}

		return true;
	}

	callStack.push_back(instruction + 1);

	unsigned prevDataSize = dataStack.size();

	unsigned argumentsSize = target.argumentSize;
	unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

	assert(dataStack.size() % 16 == 0);
	assert(argumentsSize <= stackSize);

	if(dataStack.size() + stackSize >= dataStack.max)
	{
		Stop("ERROR: stack overflow");

		return false;
	}

	// Take arguments
	tempStackPtr -= target.argumentSize >> 2;

	assert(tempStackPtr == tempStackArrayBase);

	// Copy function arguments to new stack frame
	memcpy((char*)(dataStack.data + dataStack.size()), tempStackPtr, argumentsSize);

	RegVmRegister *regFileTop = regFileLastTop;

	regFileLastTop = regFileTop + target.regVmRegisters;

	if(regFileLastTop >= regFileArrayEnd)
	{
		Stop("ERROR: register overflow");

		return false;
	}

	dataStack.resize(dataStack.size() + stackSize);

	if(stackSize - argumentsSize)
		memset(dataStack.data + prevDataSize + argumentsSize, 0, stackSize - argumentsSize);

	regFileTop[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
	regFileTop[rvrrFrame].ptrValue = uintptr_t(dataStack.data + prevDataSize);
	regFileTop[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
	regFileTop[rvrrRegisters].ptrValue = uintptr_t(regFileTop);

	memset(regFileTop + rvrrCount, 0, (regFileLastTop - regFileTop - rvrrCount) * sizeof(regFilePtr[0]));

	RegVmReturnType execResultType = RunCode(codeBase + address, regFileTop, this, codeBase);

	if(execResultType == rvrError)
		return false;

	assert(execResultType == resultType);

	regFileLastTop = regFileTop;

	dataStack.shrink(prevDataSize);

	switch(resultType)
	{
	case rvrDouble:
		memcpy(&regFilePtr[resultReg].doubleValue, tempStackPtr, sizeof(double));
		break;
	case rvrLong:
		memcpy(&regFilePtr[resultReg].longValue, tempStackPtr, sizeof(long long));
		break;
	case rvrInt:
		regFilePtr[resultReg].intValue = *tempStackPtr;
		break;
	default:
		break;
	}

	unsigned *curr = tempStackPtr;

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPop:
			regFilePtr[*microcode++].intValue = *curr;
			curr += 1;
			break;
		case rvmiPopq:
			regFilePtr[*microcode++].longValue = vmLoadLong(curr);
			curr += 2;
			break;
		case rvmiPopMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;
			memcpy((char*)regFilePtr[reg].ptrValue + offset, curr, size);
			curr += size >> 2;
		}
		break;
		}
	}

	return true;
}